

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_bfset_mem_m68k(CPUM68KState_conflict *env,uint32_t addr,int32_t ofs,uint32_t len)

{
  uint64_t uVar1;
  ulong uVar2;
  bf_data bVar3;
  uintptr_t unaff_retaddr;
  uint64_t mask;
  uint64_t data;
  bf_data d;
  uintptr_t ra;
  uint32_t len_local;
  int32_t ofs_local;
  uint32_t addr_local;
  CPUM68KState_conflict *env_local;
  
  bVar3 = bf_prep(addr,ofs,len);
  data._0_4_ = bVar3.addr;
  d.addr = bVar3.blen;
  uVar1 = bf_load(env,(uint32_t)data,d.addr,unaff_retaddr);
  uVar2 = (ulong)(-1L << (0x40U - (char)bVar3.len & 0x3f)) >> ((byte)bVar3.bofs & 0x3f);
  bf_store(env,(uint32_t)data,d.addr,uVar1 | uVar2,unaff_retaddr);
  return (uint32_t)(((uVar1 & uVar2) << ((byte)bVar3.bofs & 0x3f)) >> 0x20);
}

Assistant:

uint32_t HELPER(bfset_mem)(CPUM68KState *env, uint32_t addr,
                           int32_t ofs, uint32_t len)
{
    uintptr_t ra = GETPC();
    struct bf_data d = bf_prep(addr, ofs, len);
    uint64_t data = bf_load(env, d.addr, d.blen, ra);
#ifdef _MSC_VER
    uint64_t mask = 0xffffffffffffffffULL << (64 - d.len) >> d.bofs;
#else
    uint64_t mask = -1ull << (64 - d.len) >> d.bofs;
#endif

    bf_store(env, d.addr, d.blen, data | mask, ra);

    return ((data & mask) << d.bofs) >> 32;
}